

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeOverwriteCell(BtCursor *pCur,BtreePayload *pX)

{
  BtShared *pBt_00;
  int iVar1;
  int local_48;
  Pgno local_44;
  u32 ovflPageSize;
  Pgno ovflPgno;
  BtShared *pBt;
  MemPage *pPage;
  uint local_28;
  int rc;
  int nTotal;
  int iOffset;
  BtreePayload *pX_local;
  BtCursor *pCur_local;
  
  local_28 = pX->nData + pX->nZero;
  pBt = (BtShared *)pCur->pPage;
  _nTotal = pX;
  pX_local = (BtreePayload *)pCur;
  if (pBt->pHasContent < (Bitvec *)((pCur->info).pPayload + (int)(uint)(pCur->info).nLocal)) {
    pCur_local._4_4_ = sqlite3CorruptError(0x11834);
  }
  else {
    pPage._4_4_ = btreeOverwriteContent
                            ((MemPage *)pBt,(pCur->info).pPayload,pX,0,(uint)(pCur->info).nLocal);
    pCur_local._4_4_ = pPage._4_4_;
    if (pPage._4_4_ == 0) {
      if (*(ushort *)((long)&pX_local[1].pData + 4) == local_28) {
        pCur_local._4_4_ = 0;
      }
      else {
        rc = (int)*(ushort *)((long)&pX_local[1].pData + 4);
        local_44 = sqlite3Get4byte((u8 *)(pX_local[1].nKey + (long)rc));
        pBt_00 = (BtShared *)pBt->xFreeSchema;
        local_48 = pBt_00->usableSize - 4;
        do {
          pPage._4_4_ = btreeGetPage(pBt_00,local_44,(MemPage **)&pBt,0);
          if (pPage._4_4_ != 0) {
            return pPage._4_4_;
          }
          iVar1 = sqlite3PagerPageRefcount((DbPage *)pBt->pLock);
          if (iVar1 == 1) {
            if ((uint)(rc + local_48) < local_28) {
              local_44 = sqlite3Get4byte((u8 *)pBt->mutex);
            }
            else {
              local_48 = local_28 - rc;
            }
            pPage._4_4_ = btreeOverwriteContent
                                    ((MemPage *)pBt,(u8 *)&(pBt->mutex->mutex).__data.__count,
                                     _nTotal,rc,local_48);
          }
          else {
            pPage._4_4_ = sqlite3CorruptError(0x11847);
          }
          sqlite3PagerUnref((DbPage *)pBt->pLock);
          if (pPage._4_4_ != 0) {
            return pPage._4_4_;
          }
          rc = local_48 + rc;
        } while (rc < (int)local_28);
        pCur_local._4_4_ = 0;
      }
    }
  }
  return pCur_local._4_4_;
}

Assistant:

static int btreeOverwriteCell(BtCursor *pCur, const BtreePayload *pX){
  int iOffset;                        /* Next byte of pX->pData to write */
  int nTotal = pX->nData + pX->nZero; /* Total bytes of to write */
  int rc;                             /* Return code */
  MemPage *pPage = pCur->pPage;       /* Page being written */
  BtShared *pBt;                      /* Btree */
  Pgno ovflPgno;                      /* Next overflow page to write */
  u32 ovflPageSize;                   /* Size to write on overflow page */

  if( pCur->info.pPayload + pCur->info.nLocal > pPage->aDataEnd ){
    return SQLITE_CORRUPT_BKPT;
  }
  /* Overwrite the local portion first */
  rc = btreeOverwriteContent(pPage, pCur->info.pPayload, pX,
                             0, pCur->info.nLocal);
  if( rc ) return rc;
  if( pCur->info.nLocal==nTotal ) return SQLITE_OK;

  /* Now overwrite the overflow pages */
  iOffset = pCur->info.nLocal;
  assert( nTotal>=0 );
  assert( iOffset>=0 );
  ovflPgno = get4byte(pCur->info.pPayload + iOffset);
  pBt = pPage->pBt;
  ovflPageSize = pBt->usableSize - 4;
  do{
    rc = btreeGetPage(pBt, ovflPgno, &pPage, 0);
    if( rc ) return rc;
    if( sqlite3PagerPageRefcount(pPage->pDbPage)!=1 ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      if( iOffset+ovflPageSize<(u32)nTotal ){
        ovflPgno = get4byte(pPage->aData);
      }else{
        ovflPageSize = nTotal - iOffset;
      }
      rc = btreeOverwriteContent(pPage, pPage->aData+4, pX,
                                 iOffset, ovflPageSize);
    }
    sqlite3PagerUnref(pPage->pDbPage);
    if( rc ) return rc;
    iOffset += ovflPageSize;
  }while( iOffset<nTotal );
  return SQLITE_OK;    
}